

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTestCaseBase.cpp
# Opt level: O0

string * __thiscall
glcts::TestCaseBase::specializeShader_abi_cxx11_
          (string *__return_storage_ptr__,TestCaseBase *this,uint parts,char **code)

{
  char *__s;
  allocator<char> local_229;
  string local_228 [32];
  string local_208;
  StringTemplate local_1e8;
  uint local_1b4;
  stringstream local_1b0 [4];
  uint i;
  stringstream code_merged;
  ostream local_1a0;
  char **local_28;
  char **code_local;
  TestCaseBase *pTStack_18;
  uint parts_local;
  TestCaseBase *this_local;
  
  local_28 = code;
  code_local._4_4_ = parts;
  pTStack_18 = this;
  this_local = (TestCaseBase *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b0);
  for (local_1b4 = 0; local_1b4 < code_local._4_4_; local_1b4 = local_1b4 + 1) {
    std::operator<<(&local_1a0,local_28[local_1b4]);
  }
  std::__cxx11::stringstream::str();
  __s = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,__s,&local_229);
  tcu::StringTemplate::StringTemplate(&local_1e8,&local_208);
  tcu::StringTemplate::specialize(__return_storage_ptr__,&local_1e8,&this->m_specializationMap);
  tcu::StringTemplate::~StringTemplate(&local_1e8);
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::~allocator(&local_229);
  std::__cxx11::string::~string(local_228);
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

std::string TestCaseBase::specializeShader(const unsigned int parts, const char* const* code) const
{
	std::stringstream code_merged;
	for (unsigned int i = 0; i < parts; i++)
	{
		code_merged << code[i];
	}
	return tcu::StringTemplate(code_merged.str().c_str()).specialize(m_specializationMap);
}